

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O0

void __thiscall
MinVR::VRDisplayNode::_addValueNeeded(VRDisplayNode *this,string *name,bool required)

{
  byte in_DL;
  long in_RDI;
  value_type *__x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *in_stack_ffffffffffffffb0;
  value_type local_40;
  byte local_11;
  
  local_11 = in_DL & 1;
  __x = &local_40;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_true>
            (in_stack_ffffffffffffffb0,&__x->first,(bool *)(in_RDI + 0x58));
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::push_back((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)in_stack_ffffffffffffffb0,__x);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *)0x177423);
  return;
}

Assistant:

void _addValueNeeded(const std::string name, const bool required = true) {
    _valuesNeeded.push_back(std::pair<std::string, bool>(name, required));
  }